

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

void __thiscall
eastl::basic_string<char,_eastl::allocator>::AllocateSelf
          (basic_string<char,_eastl::allocator> *this,size_type n)

{
  value_type *pvVar1;
  value_type *pvVar2;
  
  if (n < 2) {
    pvVar1 = (value_type *)&gEmptyString;
    pvVar2 = (value_type *)((long)&gEmptyString + 1);
  }
  else {
    pvVar1 = (value_type *)malloc((ulong)n);
    pvVar2 = pvVar1 + n;
  }
  this->mpBegin = pvVar1;
  this->mpEnd = pvVar1;
  this->mpCapacity = pvVar2;
  return;
}

Assistant:

void basic_string<T, Allocator>::AllocateSelf(size_type n)
    {
        #if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY(n >= 0x40000000))
                EASTL_FAIL_MSG("basic_string::AllocateSelf -- improbably large request.");
        #endif

        #if EASTL_STRING_OPT_LENGTH_ERRORS
            if(EASTL_UNLIKELY(n > kMaxSize))
                ThrowLengthException();
        #endif

        if(n > 1)
        {
            mpBegin    = DoAllocate(n);
            mpEnd      = mpBegin;
            mpCapacity = mpBegin + n;
        }
        else
            AllocateSelf();
    }